

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigMiterProve(Ivy_FraigMan_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Ivy_Obj_t *pIVar3;
  void **ppvVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  Ivy_Obj_t *pIVar9;
  sat_solver *psVar10;
  double *pdVar11;
  void *pvVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  Ivy_Obj_t *pNew;
  long lVar16;
  Ivy_Man_t *pIVar17;
  timespec ts;
  timespec local_48;
  uint local_38;
  lit local_34;
  
  clock_gettime(3,&local_48);
  pVVar8 = p->pManAig->vPos;
  if (pVVar8->nSize < 1) {
    return;
  }
  lVar16 = 0;
  while( true ) {
    pvVar12 = pVVar8->pArray[lVar16];
    if (((ulong)pvVar12 & 1) != 0) {
      __assert_fail("!Ivy_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                    ,0x113,"Ivy_Obj_t *Ivy_ObjChild0Equiv(Ivy_Obj_t *)");
    }
    uVar13 = *(ulong *)((long)pvVar12 + 0x10) & 0xfffffffffffffffe;
    if (uVar13 == 0) {
      pIVar9 = (Ivy_Obj_t *)0x0;
    }
    else {
      pIVar9 = (Ivy_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar12 + 0x10) & 1) ^ *(ulong *)(uVar13 + 0x48));
    }
    pIVar17 = p->pManFraig;
    pIVar3 = pIVar17->pConst1;
    if (pIVar9 == pIVar3) break;
    if (pIVar9 != (Ivy_Obj_t *)((ulong)pIVar3 ^ 1)) {
      pNew = (Ivy_Obj_t *)((ulong)pIVar9 & 0xfffffffffffffffe);
      if ((((uint)pIVar9 ^ *(uint *)&pNew->field_0x8 >> 7) & 1) != 0) break;
      if (pIVar3 == pNew) {
        __assert_fail("pNew != p->pManFraig->pConst1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0x8e2,"int Ivy_FraigNodeIsConst(Ivy_FraigMan_t *, Ivy_Obj_t *)");
      }
      p->nSatCalls = p->nSatCalls + 1;
      if (p->pSat == (sat_solver *)0x0) {
        psVar10 = sat_solver_new();
        p->pSat = psVar10;
        sat_solver_setnvars(psVar10,1000);
        psVar10 = p->pSat;
        pdVar11 = (double *)calloc((long)psVar10->cap,8);
        psVar10->factors = pdVar11;
        p->nSatVars = 1;
      }
      Ivy_FraigNodeAddToSolver(p,(Ivy_Obj_t *)0x0,pNew);
      Ivy_FraigSetActivityFactors(p,(Ivy_Obj_t *)0x0,pNew);
      iVar6 = clock_gettime(3,&local_48);
      if (iVar6 < 0) {
        lVar14 = 1;
      }
      else {
        lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
        lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_48.tv_sec * -1000000;
      }
      local_38 = (*(uint *)&pNew->field_0x8 >> 7 & 1) + *(int *)&pNew->pNextFan0 * 2;
      iVar6 = sat_solver_solve(p->pSat,(lit *)&local_38,&local_34,(long)p->pParams->nBTLimitMiter,0,
                               p->nBTLimitGlobal,p->nInsLimitGlobal);
      iVar7 = clock_gettime(3,&local_48);
      if (iVar7 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      p->timeSat = p->timeSat + lVar15 + lVar14;
      if (iVar6 == -1) {
        iVar6 = clock_gettime(3,&local_48);
        if (iVar6 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
        }
        p->timeSatUnsat = p->timeSatUnsat + lVar15 + lVar14;
        local_38 = local_38 ^ 1;
        iVar6 = sat_solver_addclause(p->pSat,(lit *)&local_38,&local_34);
        if (iVar6 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                        ,0x903,"int Ivy_FraigNodeIsConst(Ivy_FraigMan_t *, Ivy_Obj_t *)");
        }
        uVar1 = p->nSatCallsUnsat;
        uVar2 = p->nSatProof;
        p->nSatCallsUnsat = uVar1 + 1;
        p->nSatProof = uVar2 + 1;
        *(ulong *)((*(ulong *)((long)pvVar12 + 0x10) & 0xfffffffffffffffe) + 0x48) =
             (ulong)((uint)*(ulong *)((long)pvVar12 + 0x10) & 1) ^ (ulong)p->pManFraig->pConst1 ^ 1;
      }
      else {
        if (iVar6 == 1) {
          iVar6 = clock_gettime(3,&local_48);
          if (iVar6 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
          }
          p->timeSatSat = p->timeSatSat + lVar16 + lVar14;
          if (p->pPatWords != (uint *)0x0) {
            Ivy_FraigSavePattern(p);
          }
          p->nSatCallsSat = p->nSatCallsSat + 1;
          pIVar17 = p->pManFraig;
          pvVar12 = malloc((long)pIVar17->nObjs[1] << 2);
          lVar16 = (long)pIVar17->vPis->nSize;
          if (0 < lVar16) {
            ppvVar4 = pIVar17->vPis->pArray;
            piVar5 = p->pSat->model;
            lVar14 = 0;
            do {
              *(uint *)((long)pvVar12 + lVar14 * 4) =
                   (uint)(piVar5[*(int *)((long)ppvVar4[lVar14] + 0x28)] == 1);
              lVar14 = lVar14 + 1;
            } while (lVar16 != lVar14);
          }
LAB_007df5df:
          pIVar17->pData = pvVar12;
          return;
        }
        iVar6 = clock_gettime(3,&local_48);
        if (iVar6 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
        }
        p->timeSatFail = p->timeSatFail + lVar15 + lVar14;
        pNew->field_0x9 = pNew->field_0x9 | 1;
        p->nSatFailsReal = p->nSatFailsReal + 1;
      }
    }
    lVar16 = lVar16 + 1;
    pVVar8 = p->pManAig->vPos;
    if (pVVar8->nSize <= lVar16) {
      return;
    }
  }
  pvVar12 = calloc(1,(long)pIVar17->nObjs[1] << 2);
  goto LAB_007df5df;
}

Assistant:

void Ivy_FraigMiterProve( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj, * pObjNew;
    int i, RetValue;
    abctime clk = Abc_Clock();
    int fVerbose = 0;
    Ivy_ManForEachPo( p->pManAig, pObj, i )
    {
        if ( i && fVerbose )
        {
            ABC_PRT( "Time", Abc_Clock() -clk );
        }
        pObjNew = Ivy_ObjChild0Equiv(pObj);
        // check if the output is constant 1
        if ( pObjNew == p->pManFraig->pConst1 )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) is constant 1.  ", i, Ivy_ManPoNum(p->pManAig) );
            // assing constant 0 model
            p->pManFraig->pData = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
            memset( p->pManFraig->pData, 0, sizeof(int) * Ivy_ManPiNum(p->pManFraig) );
            break;
        }
        // check if the output is constant 0
        if ( pObjNew == Ivy_Not(p->pManFraig->pConst1) )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) is already constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            continue;
        }
        // check if the output can be constant 0
        if ( Ivy_Regular(pObjNew)->fPhase != (unsigned)Ivy_IsComplement(pObjNew) )
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) cannot be constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            // assing constant 0 model
            p->pManFraig->pData = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
            memset( p->pManFraig->pData, 0, sizeof(int) * Ivy_ManPiNum(p->pManFraig) );
            break;
        }
/*
        // check the representative of this node
        pRepr = Ivy_ObjClassNodeRepr(Ivy_ObjFanin0(pObj));
        if ( Ivy_Regular(pRepr) != p->pManAig->pConst1 )
            printf( "Representative is not constant 1.\n" );
        else
            printf( "Representative is constant 1.\n" );
*/
        // try to prove the output constant 0
        RetValue = Ivy_FraigNodeIsConst( p, Ivy_Regular(pObjNew) );
        if ( RetValue == 1 )  // proved equivalent
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) was proved constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
            // set the constant miter
            Ivy_ObjFanin0(pObj)->pEquiv = Ivy_NotCond( p->pManFraig->pConst1, !Ivy_ObjFaninC0(pObj) );
            continue;
        }
        if ( RetValue == -1 ) // failed
        {
            if ( fVerbose )
                printf( "Output %2d (out of %2d) has timed out at %d backtracks.  ", i, Ivy_ManPoNum(p->pManAig), p->pParams->nBTLimitMiter );
            continue;
        }
        // proved satisfiable
        if ( fVerbose )
            printf( "Output %2d (out of %2d) was proved NOT a constant 0.  ", i, Ivy_ManPoNum(p->pManAig) );
        // create the model
        p->pManFraig->pData = Ivy_FraigCreateModel(p);
        break;
    }
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() -clk );
    }
}